

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O1

ly_bool lyd_is_default(lyd_node *node)

{
  lysc_node *plVar1;
  lysc_node *plVar2;
  int iVar3;
  void *pvVar4;
  lys_module *plVar5;
  void *pvVar6;
  
  plVar1 = node->schema;
  if ((plVar1->nodetype & 0xc) != 0) {
    if (plVar1->nodetype == 4) {
      if ((plVar1[1].prev != (lysc_node *)0x0) &&
         (iVar3 = (*(code *)(plVar1[1].parent)->parent->next)(plVar1->module->ctx,node + 1),
         iVar3 == 0)) {
        return '\x01';
      }
    }
    else if (plVar1[1].prev != (lysc_node *)0x0) {
      pvVar6 = (void *)0x0;
      do {
        plVar2 = plVar1[1].prev;
        if (plVar2 == (lysc_node *)0x0) {
          pvVar4 = (void *)0x0;
        }
        else {
          pvVar4 = plVar2[-1].priv;
        }
        if (pvVar4 <= pvVar6) {
          return '\0';
        }
        plVar5 = (lys_module *)&node[2].schema;
        if (node->schema != (lysc_node *)0x0) {
          plVar5 = node->schema->module;
        }
        iVar3 = (*(code *)(plVar1[1].parent)->parent->next)
                          (plVar5->ctx,node + 1,
                           *(undefined8 *)(plVar2->hash + (long)pvVar6 * 8 + -4));
        pvVar6 = (void *)((long)pvVar6 + 1);
      } while (iVar3 != 0);
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

LIBYANG_API_DEF ly_bool
lyd_is_default(const struct lyd_node *node)
{
    const struct lysc_node_leaf *leaf;
    const struct lysc_node_leaflist *llist;
    const struct lyd_node_term *term;
    LY_ARRAY_COUNT_TYPE u;

    if (!(node->schema->nodetype & LYD_NODE_TERM)) {
        return 0;
    }

    term = (const struct lyd_node_term *)node;

    if (node->schema->nodetype == LYS_LEAF) {
        leaf = (const struct lysc_node_leaf *)node->schema;
        if (!leaf->dflt) {
            return 0;
        }

        /* compare with the default value */
        if (!leaf->type->plugin->compare(LYD_CTX(node), &term->value, leaf->dflt)) {
            return 1;
        }
    } else {
        llist = (const struct lysc_node_leaflist *)node->schema;
        if (!llist->dflts) {
            return 0;
        }

        LY_ARRAY_FOR(llist->dflts, u) {
            /* compare with each possible default value */
            if (!llist->type->plugin->compare(LYD_CTX(node), &term->value, llist->dflts[u])) {
                return 1;
            }
        }
    }

    return 0;
}